

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.hpp
# Opt level: O0

void __thiscall pstore::basic_logger::~basic_logger(basic_logger *this)

{
  basic_logger *this_local;
  
  (this->super_logger)._vptr_logger = (_func_int **)&PTR__basic_logger_003f9630;
  std::__cxx11::string::~string((string *)&this->thread_name_);
  logger::~logger(&this->super_logger);
  return;
}

Assistant:

basic_logger () = default;